

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::getChunkInfo
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  bool bVar2;
  size_type sVar3;
  uint uVar4;
  size_t sVar5;
  uchar *puVar6;
  pointer pcVar7;
  pointer puVar8;
  pointer chunk;
  char type [5];
  char local_6d [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  pointer local_38;
  
  puVar8 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 8;
  paVar1 = &local_68.field_2;
  chunk = local_38;
  local_48 = puVar8;
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  while( true ) {
    if (puVar8 <= chunk + 8) {
      return 0;
    }
    if (chunk < local_38) {
      return 0;
    }
    lodepng_chunk_type(local_6d,chunk);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(local_6d);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_6d,local_6d + sVar5);
    sVar3 = local_68._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (sVar3 != 4) {
      return 1;
    }
    uVar4 = lodepng_chunk_length(chunk);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(local_6d);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_6d,local_6d + sVar5);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_40,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    puVar8 = local_48;
    pcVar7 = (pointer)(ulong)uVar4;
    __position._M_current =
         (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._M_dataplus._M_p = pcVar7;
    if (__position._M_current ==
        (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (sizes,__position,(unsigned_long *)&local_68);
    }
    else {
      *__position._M_current = (unsigned_long)pcVar7;
      (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if (puVar8 < pcVar7 + 0xc + (long)chunk) break;
    puVar6 = lodepng_chunk_next_const(chunk);
    bVar2 = puVar6 <= chunk;
    chunk = puVar6;
    if (bVar2) {
      return 1;
    }
  }
  return 1;
}

Assistant:

unsigned getChunkInfo(std::vector<std::string>& names, std::vector<size_t>& sizes,
                      const std::vector<unsigned char>& png) {
  // Listing chunks is based on the original file, not the decoded png info.
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) return 1;

    unsigned length = lodepng_chunk_length(chunk);
    names.push_back(type);
    sizes.push_back(length);
    if(chunk + length + 12 > end) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow
    chunk = next;
  }
  return 0;
}